

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_stream_split_decoder.cpp
# Opt level: O2

void __thiscall duckdb::ByteStreamSplitDecoder::InitializePage(ByteStreamSplitDecoder *this)

{
  pointer __p;
  ResizeableBuffer *pRVar1;
  ResizeableBuffer *pRVar2;
  shared_ptr<duckdb::ResizeableBuffer,_true> *this_00;
  unsigned_long local_30;
  pointer local_28;
  
  this_00 = &this->reader->block;
  pRVar1 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_00);
  pRVar2 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_00);
  local_30 = (pRVar2->super_ByteBuffer).len - 1;
  make_uniq<duckdb::BssDecoder,unsigned_char*&,unsigned_long>
            ((duckdb *)&local_28,(uchar **)pRVar1,&local_30);
  __p = local_28;
  local_28 = (pointer)0x0;
  ::std::__uniq_ptr_impl<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>_>::reset
            ((__uniq_ptr_impl<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>_> *)
             &this->bss_decoder,__p);
  ::std::unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>_>::~unique_ptr
            ((unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>_> *)&local_28);
  pRVar1 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_00);
  pRVar2 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_00);
  ByteBuffer::inc(&pRVar1->super_ByteBuffer,(pRVar2->super_ByteBuffer).len);
  return;
}

Assistant:

void ByteStreamSplitDecoder::InitializePage() {
	auto &block = reader.block;
	// Subtract 1 from length as the block is allocated with 1 extra byte,
	// but the byte stream split encoder needs to know the correct data size.
	bss_decoder = make_uniq<BssDecoder>(block->ptr, block->len - 1);
	block->inc(block->len);
}